

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O0

void cf2_stack_roll(CF2_Stack stack,FT_Fast count,FT_Fast shift)

{
  CF2_StackNumber CVar1;
  FT_UFast FVar2;
  CF2_StackNumber tmp;
  FT_Fast i;
  FT_Fast idx;
  FT_Fast start_idx;
  CF2_StackNumber last;
  FT_Fast shift_local;
  FT_Fast count_local;
  CF2_Stack stack_local;
  
  idx = 0;
  start_idx = CF2_NumberInt;
  if (1 < count) {
    FVar2 = cf2_stack_count(stack);
    if (FVar2 < (uint)count) {
      cf2_setError(stack->error,0x82);
    }
    else {
      if (shift < 0) {
        last.u.r = -(-shift % count);
      }
      else {
        last.u.r = shift % count;
      }
      if (last.u.r != 0) {
        i = -1;
        tmp.type = ~CF2_NumberFixed;
        for (tmp.u.r = 0; tmp.u.r < count; tmp.u.r = tmp.u.r + 1) {
          if (i == tmp.type) {
            tmp.type = i + CF2_NumberFrac;
            _idx = stack->buffer[(int)tmp.type];
            i = tmp.type;
          }
          tmp.type = last.u.r + tmp.type;
          if ((int)tmp.type < count) {
            if ((int)tmp.type < 0) {
              tmp.type = count + tmp.type;
            }
          }
          else {
            tmp.type = tmp.type - count;
          }
          CVar1 = stack->buffer[(int)tmp.type];
          stack->buffer[(int)tmp.type] = _idx;
          _idx = CVar1;
        }
      }
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_stack_roll( CF2_Stack  stack,
                  CF2_Int    count,
                  CF2_Int    shift )
  {
    /* we initialize this variable to avoid compiler warnings */
    CF2_StackNumber  last = { { 0 }, CF2_NumberInt };

    CF2_Int  start_idx, idx, i;


    if ( count < 2 )
      return; /* nothing to do (values 0 and 1), or undefined value */

    if ( (CF2_UInt)count > cf2_stack_count( stack ) )
    {
      CF2_SET_ERROR( stack->error, Stack_Overflow );
      return;
    }

    if ( shift < 0 )
      shift = -( ( -shift ) % count );
    else
      shift %= count;

    if ( shift == 0 )
      return; /* nothing to do */

    /* We use the following algorithm to do the rolling, */
    /* which needs two temporary variables only.         */
    /*                                                   */
    /* Example:                                          */
    /*                                                   */
    /*   count = 8                                       */
    /*   shift = 2                                       */
    /*                                                   */
    /*   stack indices before roll:  7 6 5 4 3 2 1 0     */
    /*   stack indices after roll:   1 0 7 6 5 4 3 2     */
    /*                                                   */
    /* The value of index 0 gets moved to index 2, while */
    /* the old value of index 2 gets moved to index 4,   */
    /* and so on.  We thus have the following copying    */
    /* chains for shift value 2.                         */
    /*                                                   */
    /*   0 -> 2 -> 4 -> 6 -> 0                           */
    /*   1 -> 3 -> 5 -> 7 -> 1                           */
    /*                                                   */
    /* If `count' and `shift' are incommensurable, we    */
    /* have a single chain only.  Otherwise, increase    */
    /* the start index by 1 after the first chain, then  */
    /* do the next chain until all elements in all       */
    /* chains are handled.                               */

    start_idx = -1;
    idx       = -1;
    for ( i = 0; i < count; i++ )
    {
      CF2_StackNumber  tmp;


      if ( start_idx == idx )
      {
        start_idx++;
        idx  = start_idx;
        last = stack->buffer[idx];
      }

      idx += shift;
      if ( idx >= count )
        idx -= count;
      else if ( idx < 0 )
        idx += count;

      tmp                = stack->buffer[idx];
      stack->buffer[idx] = last;
      last               = tmp;
    }
  }